

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O0

PVG_FT_Error
ft_stroke_border_arcto
          (PVG_FT_StrokeBorder border,PVG_FT_Vector *center,PVG_FT_Fixed radius,
          PVG_FT_Angle angle_start,PVG_FT_Angle angle_diff)

{
  bool bVar1;
  PVG_FT_Error PVar2;
  PVG_FT_Fixed PVar3;
  PVG_FT_Long PVar4;
  long lVar5;
  long lVar6;
  int local_80;
  PVG_FT_Error error;
  PVG_FT_Int arcs;
  PVG_FT_Int i;
  PVG_FT_Vector a3;
  PVG_FT_Vector a2;
  PVG_FT_Vector a1;
  PVG_FT_Vector a0;
  PVG_FT_Fixed coef;
  PVG_FT_Angle angle_diff_local;
  PVG_FT_Angle angle_start_local;
  PVG_FT_Fixed radius_local;
  PVG_FT_Vector *center_local;
  PVG_FT_StrokeBorder border_local;
  
  local_80 = 1;
  while( true ) {
    lVar6 = (long)local_80 * 0x5a0000;
    bVar1 = true;
    if (angle_diff == lVar6 ||
        SBORROW8(angle_diff,lVar6) != angle_diff + (long)local_80 * -0x5a0000 < 0) {
      lVar6 = -angle_diff;
      lVar5 = (long)local_80 * 0x5a0000;
      bVar1 = lVar6 != lVar5 && SBORROW8(lVar6,lVar5) == lVar6 + (long)local_80 * -0x5a0000 < 0;
    }
    if (!bVar1) break;
    local_80 = local_80 + 1;
  }
  PVar3 = PVG_FT_Tan(angle_diff / (long)(local_80 << 2));
  lVar6 = PVar3 / 3 + PVar3;
  PVG_FT_Vector_From_Polar((PVG_FT_Vector *)&a1.y,radius,angle_start);
  a2.y = PVG_FT_MulFix(-a0.x,lVar6);
  PVar4 = PVG_FT_MulFix(a1.y,lVar6);
  a1.y = center->x + a1.y;
  a2.y = a1.y + a2.y;
  a1.x = center->y + a0.x + PVar4;
  error = 1;
  while( true ) {
    if (local_80 < error) {
      return 0;
    }
    PVG_FT_Vector_From_Polar
              ((PVG_FT_Vector *)&arcs,radius,angle_start + (error * angle_diff) / (long)local_80);
    a3.y = PVG_FT_MulFix(a3.x,lVar6);
    PVar4 = PVG_FT_MulFix(-_arcs,lVar6);
    _arcs = center->x + _arcs;
    a3.x = center->y + a3.x;
    a3.y = _arcs + a3.y;
    a2.x = a3.x + PVar4;
    PVar2 = ft_stroke_border_cubicto
                      (border,(PVG_FT_Vector *)&a2.y,(PVG_FT_Vector *)&a3.y,(PVG_FT_Vector *)&arcs);
    if (PVar2 != 0) break;
    a2.y = _arcs * 2 - a3.y;
    a1.x = a3.x * 2 - a2.x;
    error = error + 1;
  }
  return PVar2;
}

Assistant:

static PVG_FT_Error
ft_stroke_border_arcto( PVG_FT_StrokeBorder  border,
                        PVG_FT_Vector*       center,
                        PVG_FT_Fixed         radius,
                        PVG_FT_Angle         angle_start,
                        PVG_FT_Angle         angle_diff )
{
    PVG_FT_Fixed   coef;
    PVG_FT_Vector  a0, a1, a2, a3;
    PVG_FT_Int     i, arcs = 1;
    PVG_FT_Error   error = 0;


    /* number of cubic arcs to draw */
    while (  angle_diff > PVG_FT_ARC_CUBIC_ANGLE * arcs ||
            -angle_diff > PVG_FT_ARC_CUBIC_ANGLE * arcs )
      arcs++;

    /* control tangents */
    coef  = PVG_FT_Tan( angle_diff / ( 4 * arcs ) );
    coef += coef / 3;

    /* compute start and first control point */
    PVG_FT_Vector_From_Polar( &a0, radius, angle_start );
    a1.x = PVG_FT_MulFix( -a0.y, coef );
    a1.y = PVG_FT_MulFix(  a0.x, coef );

    a0.x += center->x;
    a0.y += center->y;
    a1.x += a0.x;
    a1.y += a0.y;

    for ( i = 1; i <= arcs; i++ )
    {
      /* compute end and second control point */
      PVG_FT_Vector_From_Polar( &a3, radius,
                            angle_start + i * angle_diff / arcs );
      a2.x = PVG_FT_MulFix(  a3.y, coef );
      a2.y = PVG_FT_MulFix( -a3.x, coef );

      a3.x += center->x;
      a3.y += center->y;
      a2.x += a3.x;
      a2.y += a3.y;

      /* add cubic arc */
      error = ft_stroke_border_cubicto( border, &a1, &a2, &a3 );
      if ( error )
        break;

      /* a0 = a3; */
      a1.x = a3.x - a2.x + a3.x;
      a1.y = a3.y - a2.y + a3.y;
    }

    return error;
}